

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyclichash.h
# Opt level: O0

unsigned_long_long __thiscall
CyclicHash<unsigned_long_long,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (CyclicHash<unsigned_long_long,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  size_type sVar1;
  byte *pbVar2;
  uint local_24;
  ulong uStack_20;
  uint k;
  unsigned_long_long answer;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *c_local;
  CyclicHash<unsigned_long_long,_unsigned_char> *this_local;
  
  uStack_20 = 0;
  local_24 = 0;
  answer = (unsigned_long_long)c;
  c_local = (deque<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  while( true ) {
    sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)answer);
    if (sVar1 <= local_24) break;
    CyclicHash<unsigned_long_long,_unsigned_char>::fastleftshift1
              ((CyclicHash<unsigned_long_long,_unsigned_char> *)this,&stack0xffffffffffffffe0);
    pbVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)answer,
                        (ulong)local_24);
    uStack_20 = *(ulong *)(this + (ulong)*pbVar2 * 8 + 0x10) ^ uStack_20;
    local_24 = local_24 + 1;
  }
  return uStack_20;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      fastleftshift1(answer);
      answer ^= hasher.hashvalues[static_cast<unsigned int>(c[k])];
    }
    return answer;
  }